

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O0

int TestReintersectConvex(ShapeHandle *shape,RNG *rng)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  float *pfVar8;
  Float FVar9;
  float fVar10;
  undefined8 uVar15;
  undefined1 in_ZMM0 [64];
  undefined1 auVar17 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined8 uVar16;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  Point3<float> PVar18;
  Vector3<float> VVar19;
  Vector3f VVar20;
  Point3f PVar21;
  Tuple3<pbrt::Vector3,_float> TVar22;
  Tuple3<pbrt::Point3,_float> TVar23;
  int c_2;
  Point3f p2_1;
  Ray rOut;
  Vector3f w;
  Point2f u;
  int j;
  int n;
  SurfaceInteraction *isect;
  optional<pbrt::ShapeIntersection> si;
  Ray r;
  Point3f p2;
  int c_1;
  Point3f t;
  Bounds3f bbox;
  int c;
  Point3f o;
  undefined4 in_stack_fffffffffffff938;
  Float in_stack_fffffffffffff93c;
  undefined2 in_stack_fffffffffffff940;
  byte in_stack_fffffffffffff942;
  undefined1 in_stack_fffffffffffff943;
  float in_stack_fffffffffffff944;
  float in_stack_fffffffffffff948;
  float in_stack_fffffffffffff94c;
  undefined4 in_stack_fffffffffffff950;
  Float in_stack_fffffffffffff954;
  undefined4 in_stack_fffffffffffff958;
  Float in_stack_fffffffffffff95c;
  undefined4 in_stack_fffffffffffff960;
  float in_stack_fffffffffffff964;
  ShapeHandle *in_stack_fffffffffffff968;
  undefined4 in_stack_fffffffffffff980;
  float in_stack_fffffffffffff984;
  undefined8 in_stack_fffffffffffff988;
  Point3f *p2_00;
  undefined4 in_stack_fffffffffffff9d8;
  Float in_stack_fffffffffffff9dc;
  optional<pbrt::ShapeIntersection> local_5c0;
  Tuple3<pbrt::Point3,_float> local_490;
  undefined8 local_480;
  float local_478;
  undefined8 local_470;
  float local_468;
  Tuple3<pbrt::Point3,_float> local_460;
  undefined8 local_450;
  float local_448;
  undefined8 local_440;
  float local_438;
  undefined8 local_430;
  float local_428;
  undefined8 local_420;
  float local_418;
  undefined8 local_410;
  float local_408;
  undefined8 local_400;
  float local_3f8;
  int local_3f4;
  Tuple3<pbrt::Point3,_float> local_3f0;
  optional<pbrt::ShapeIntersection> local_3e0;
  undefined8 local_250;
  float local_248;
  undefined8 local_240;
  float local_238;
  undefined8 local_230;
  float local_228;
  undefined8 local_220;
  float local_218;
  Tuple2<pbrt::Point2,_float> local_214;
  int local_20c;
  int local_208;
  ShapeIntersection *local_1f8;
  undefined4 local_1ec;
  optional local_1e8 [264];
  undefined8 local_e0;
  float local_d8;
  undefined8 local_cc;
  float local_c4;
  undefined8 local_b8;
  float local_b0;
  undefined8 local_a4;
  float local_9c;
  undefined8 local_8c;
  float local_84;
  undefined8 local_70;
  float local_68;
  undefined8 local_60;
  float local_58;
  int local_50;
  Tuple3<pbrt::Point3,_float> local_4c [3];
  int local_28;
  Tuple3<pbrt::Point3,_float> local_24 [2];
  int local_4;
  
  pbrt::Point3<float>::Point3((Point3<float> *)0x568e3c);
  for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
    FVar9 = pExp((RNG *)CONCAT44(in_stack_fffffffffffff944,
                                 CONCAT13(in_stack_fffffffffffff943,
                                          CONCAT12(in_stack_fffffffffffff942,
                                                   in_stack_fffffffffffff940))),
                 in_stack_fffffffffffff93c);
    pfVar8 = pbrt::Tuple3<pbrt::Point3,_float>::operator[](local_24,local_28);
    in_ZMM0 = ZEXT464((uint)FVar9);
    *pfVar8 = FVar9;
  }
  pbrt::ShapeHandle::Bounds
            ((ShapeHandle *)
             CONCAT44(in_stack_fffffffffffff944,
                      CONCAT13(in_stack_fffffffffffff943,
                               CONCAT12(in_stack_fffffffffffff942,in_stack_fffffffffffff940))));
  pbrt::Point3<float>::Point3((Point3<float> *)0x568ec5);
  for (local_50 = 0; auVar17 = in_ZMM0._8_56_, local_50 < 3; local_50 = local_50 + 1) {
    fVar10 = pbrt::RNG::Uniform<float>
                       ((RNG *)CONCAT44(in_stack_fffffffffffff944,
                                        CONCAT13(in_stack_fffffffffffff943,
                                                 CONCAT12(in_stack_fffffffffffff942,
                                                          in_stack_fffffffffffff940))));
    pfVar8 = pbrt::Tuple3<pbrt::Point3,_float>::operator[](local_4c,local_50);
    in_ZMM0 = ZEXT464((uint)fVar10);
    *pfVar8 = fVar10;
  }
  PVar18 = pbrt::Bounds3<float>::Lerp
                     ((Bounds3<float> *)
                      CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                      (Point3f *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
  local_68 = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
  auVar13._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar13._8_56_ = auVar17;
  local_70 = vmovlpd_avx(auVar13._0_16_);
  local_60 = local_70;
  local_58 = local_68;
  VVar19 = pbrt::Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950)
                      ,(Point3<float> *)
                       CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
  local_b0 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_56_ = auVar17;
  local_b8 = vmovlpd_avx(auVar11._0_16_);
  local_a4 = local_b8;
  local_9c = local_b0;
  pbrt::MediumHandle::TaggedPointer
            ((MediumHandle *)
             CONCAT44(in_stack_fffffffffffff944,
                      CONCAT13(in_stack_fffffffffffff943,
                               CONCAT12(in_stack_fffffffffffff942,in_stack_fffffffffffff940))),
             (nullptr_t)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
  pbrt::Ray::Ray((Ray *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                 (Point3f *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                 (Vector3f *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                 in_stack_fffffffffffff94c,
                 (MediumHandle *)
                 CONCAT44(in_stack_fffffffffffff944,
                          CONCAT13(in_stack_fffffffffffff943,
                                   CONCAT12(in_stack_fffffffffffff942,in_stack_fffffffffffff940))));
  fVar10 = pbrt::RNG::Uniform<float>
                     ((RNG *)CONCAT44(in_stack_fffffffffffff944,
                                      CONCAT13(in_stack_fffffffffffff943,
                                               CONCAT12(in_stack_fffffffffffff942,
                                                        in_stack_fffffffffffff940))));
  auVar17 = ZEXT856(0);
  if (fVar10 < 0.5) {
    VVar19 = pbrt::Normalize<float>
                       ((Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
    local_d8 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar12._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar12._8_56_ = auVar17;
    local_e0 = vmovlpd_avx(auVar12._0_16_);
    local_cc = local_e0;
    local_c4 = local_d8;
    local_8c = local_e0;
    local_84 = local_d8;
  }
  pbrt::ShapeHandle::Intersect
            (in_stack_fffffffffffff968,
             (Ray *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
             in_stack_fffffffffffff95c);
  bVar7 = pstd::optional::operator_cast_to_bool(local_1e8);
  if (bVar7) {
    local_1f8 = pstd::optional<pbrt::ShapeIntersection>::operator->
                          ((optional<pbrt::ShapeIntersection> *)0x5690c4);
    TVar22.z = in_stack_fffffffffffff984;
    TVar22.x = (float)(int)in_stack_fffffffffffff988;
    TVar22.y = (float)(int)((ulong)in_stack_fffffffffffff988 >> 0x20);
    TVar23.z = in_stack_fffffffffffff964;
    TVar23._0_8_ = in_stack_fffffffffffff968;
    local_208 = 0;
    for (local_20c = 0; local_20c < 1000; local_20c = local_20c + 1) {
      pbrt::Point2<float>::Point2
                ((Point2<float> *)
                 CONCAT44(in_stack_fffffffffffff944,
                          CONCAT13(in_stack_fffffffffffff943,
                                   CONCAT12(in_stack_fffffffffffff942,in_stack_fffffffffffff940))));
      fVar10 = pbrt::RNG::Uniform<float>
                         ((RNG *)CONCAT44(in_stack_fffffffffffff944,
                                          CONCAT13(in_stack_fffffffffffff943,
                                                   CONCAT12(in_stack_fffffffffffff942,
                                                            in_stack_fffffffffffff940))));
      pfVar8 = pbrt::Tuple2<pbrt::Point2,_float>::operator[](&local_214,0);
      *pfVar8 = fVar10;
      fVar10 = pbrt::RNG::Uniform<float>
                         ((RNG *)CONCAT44(in_stack_fffffffffffff944,
                                          CONCAT13(in_stack_fffffffffffff943,
                                                   CONCAT12(in_stack_fffffffffffff942,
                                                            in_stack_fffffffffffff940))));
      pfVar8 = pbrt::Tuple2<pbrt::Point2,_float>::operator[](&local_214,1);
      uVar15 = 0;
      *pfVar8 = fVar10;
      VVar20 = pbrt::SampleUniformSphere((Point2f *)CONCAT44(TVar23.z,in_stack_fffffffffffff960));
      local_228 = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
      uVar16 = 0;
      auVar6._8_8_ = uVar15;
      auVar6._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      local_230 = vmovlpd_avx(auVar6);
      local_220 = local_230;
      local_218 = local_228;
      VVar19 = pbrt::FaceForward<float>
                         ((Vector3<float> *)CONCAT44(TVar23.z,in_stack_fffffffffffff960),
                          (Normal3<float> *)
                          CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
      local_248 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar5._8_8_ = uVar16;
      auVar5._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      local_250 = vmovlpd_avx(auVar5);
      local_240 = local_250;
      local_238 = local_248;
      local_220 = local_250;
      local_218 = local_248;
      pbrt::Interaction::SpawnRay
                (TVar22._0_8_,(Vector3f *)CONCAT44(TVar22.z,in_stack_fffffffffffff980));
      pbrt::Ray::Ray((Ray *)CONCAT44(in_stack_fffffffffffff944,
                                     CONCAT13(in_stack_fffffffffffff943,
                                              CONCAT12(in_stack_fffffffffffff942,
                                                       in_stack_fffffffffffff940))),
                     (Ray *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
      bVar7 = pbrt::ShapeHandle::IntersectP
                        ((ShapeHandle *)CONCAT44(TVar23.z,in_stack_fffffffffffff960),
                         (Ray *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                         in_stack_fffffffffffff954);
      if (bVar7) {
        local_208 = local_208 + 1;
      }
      auVar13 = ZEXT464(0x7f800000);
      pbrt::ShapeHandle::Intersect
                (TVar23._0_8_,(Ray *)CONCAT44(TVar23.z,in_stack_fffffffffffff960),
                 in_stack_fffffffffffff95c);
      bVar7 = pstd::optional<pbrt::ShapeIntersection>::has_value(&local_3e0);
      pstd::optional<pbrt::ShapeIntersection>::~optional
                ((optional<pbrt::ShapeIntersection> *)0x569361);
      if (bVar7) {
        local_208 = local_208 + 1;
      }
      pbrt::Point3<float>::Point3((Point3<float> *)0x56938c);
      for (local_3f4 = 0; auVar17 = auVar13._8_56_, local_3f4 < 3; local_3f4 = local_3f4 + 1) {
        in_stack_fffffffffffff9dc =
             pExp((RNG *)CONCAT44(in_stack_fffffffffffff944,
                                  CONCAT13(in_stack_fffffffffffff943,
                                           CONCAT12(in_stack_fffffffffffff942,
                                                    in_stack_fffffffffffff940))),
                  in_stack_fffffffffffff93c);
        pfVar8 = pbrt::Tuple3<pbrt::Point3,_float>::operator[](&local_3f0,local_3f4);
        auVar13 = ZEXT464((uint)in_stack_fffffffffffff9dc);
        *pfVar8 = in_stack_fffffffffffff9dc;
      }
      PVar21 = pbrt::Interaction::p
                         ((Interaction *)
                          CONCAT44(in_stack_fffffffffffff944,
                                   CONCAT13(in_stack_fffffffffffff943,
                                            CONCAT12(in_stack_fffffffffffff942,
                                                     in_stack_fffffffffffff940))));
      local_418 = PVar21.super_Tuple3<pbrt::Point3,_float>.z;
      auVar14._0_8_ = PVar21.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar14._8_56_ = auVar17;
      p2_00 = auVar17._0_8_;
      uVar15 = 0;
      local_420 = vmovlpd_avx(auVar14._0_16_);
      local_410 = local_420;
      local_408 = local_418;
      VVar19 = pbrt::Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                          (Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
      local_428 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
      uVar16 = 0;
      auVar4._8_8_ = uVar15;
      auVar4._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      local_430 = vmovlpd_avx(auVar4);
      local_400 = local_430;
      local_3f8 = local_428;
      local_220 = local_430;
      local_218 = local_428;
      TVar22 = (Tuple3<pbrt::Vector3,_float>)
               pbrt::FaceForward<float>
                         ((Vector3<float> *)CONCAT44(TVar23.z,in_stack_fffffffffffff960),
                          (Normal3<float> *)
                          CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
      local_448 = TVar22.z;
      uVar15 = 0;
      auVar3._8_8_ = uVar16;
      auVar3._0_8_ = TVar22._0_8_;
      local_450 = vmovlpd_avx(auVar3);
      local_440 = local_450;
      local_438 = local_448;
      local_220 = local_450;
      local_218 = local_448;
      TVar23 = (Tuple3<pbrt::Point3,_float>)
               pbrt::Interaction::p
                         ((Interaction *)
                          CONCAT44(in_stack_fffffffffffff944,
                                   CONCAT13(in_stack_fffffffffffff943,
                                            CONCAT12(in_stack_fffffffffffff942,
                                                     in_stack_fffffffffffff940))));
      local_478 = TVar23.z;
      uVar16 = 0;
      auVar2._8_8_ = uVar15;
      auVar2._0_8_ = TVar23._0_8_;
      local_480 = vmovlpd_avx(auVar2);
      local_470 = local_480;
      local_468 = local_478;
      PVar18 = pbrt::Point3<float>::operator+
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                          (Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
      in_stack_fffffffffffff944 = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
      in_stack_fffffffffffff948 = PVar18.super_Tuple3<pbrt::Point3,_float>.x;
      in_stack_fffffffffffff94c = PVar18.super_Tuple3<pbrt::Point3,_float>.y;
      in_stack_fffffffffffff950 = (undefined4)uVar16;
      in_stack_fffffffffffff954 = (Float)((ulong)uVar16 >> 0x20);
      auVar1._8_4_ = in_stack_fffffffffffff950;
      auVar1._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar1._12_4_ = in_stack_fffffffffffff954;
      local_490._0_8_ = vmovlpd_avx(auVar1);
      local_490.z = in_stack_fffffffffffff944;
      local_460._0_8_ = local_490._0_8_;
      local_460.z = in_stack_fffffffffffff944;
      local_3f0._0_8_ = local_490._0_8_;
      local_3f0.z = in_stack_fffffffffffff944;
      pbrt::Interaction::SpawnRayTo
                ((Interaction *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),p2_00)
      ;
      pbrt::Ray::operator=
                ((Ray *)CONCAT44(in_stack_fffffffffffff944,
                                 CONCAT13(in_stack_fffffffffffff943,
                                          CONCAT12(in_stack_fffffffffffff942,
                                                   in_stack_fffffffffffff940))),
                 (Ray *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
      in_stack_fffffffffffff943 =
           pbrt::ShapeHandle::IntersectP
                     ((ShapeHandle *)CONCAT44(TVar23.z,in_stack_fffffffffffff960),
                      (Ray *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                      in_stack_fffffffffffff954);
      if ((bool)in_stack_fffffffffffff943) {
        local_208 = local_208 + 1;
      }
      pbrt::ShapeHandle::Intersect
                (TVar23._0_8_,(Ray *)CONCAT44(TVar23.z,in_stack_fffffffffffff960),
                 in_stack_fffffffffffff95c);
      in_stack_fffffffffffff942 = pstd::optional<pbrt::ShapeIntersection>::has_value(&local_5c0);
      pstd::optional<pbrt::ShapeIntersection>::~optional
                ((optional<pbrt::ShapeIntersection> *)0x5696e3);
      if ((in_stack_fffffffffffff942 & 1) != 0) {
        local_208 = local_208 + 1;
      }
    }
    local_4 = local_208;
  }
  else {
    local_4 = 0;
  }
  local_1ec = 1;
  pstd::optional<pbrt::ShapeIntersection>::~optional((optional<pbrt::ShapeIntersection> *)0x56973c);
  return local_4;
}

Assistant:

static int TestReintersectConvex(ShapeHandle shape, RNG &rng) {
    // Ray origin
    Point3f o;
    for (int c = 0; c < 3; ++c)
        o[c] = pExp(rng);

    // Destination: a random point in the shape's bounding box.
    Bounds3f bbox = shape.Bounds();
    Point3f t;
    for (int c = 0; c < 3; ++c)
        t[c] = rng.Uniform<Float>();
    Point3f p2 = bbox.Lerp(t);

    // Ray to intersect with the shape.
    Ray r(o, p2 - o);
    if (rng.Uniform<Float>() < .5)
        r.d = Normalize(r.d);

    // We should usually (but not always) find an intersection.
    auto si = shape.Intersect(r);
    if (!si)
        return 0;
    SurfaceInteraction &isect = si->intr;

    // Now trace a bunch of rays leaving the intersection point.
    int n = 0;
    for (int j = 0; j < 1000; ++j) {
        // Random direction leaving the intersection point.
        Point2f u;
        u[0] = rng.Uniform<Float>();
        u[1] = rng.Uniform<Float>();
        Vector3f w = SampleUniformSphere(u);
        // Make sure it's in the same hemisphere as the surface normal.
        w = FaceForward(w, isect.n);
        Ray rOut = isect.SpawnRay(w);

        if (shape.IntersectP(rOut))
            ++n;
        if (shape.Intersect(rOut).has_value())
            ++n;

        // Choose a random point to trace rays to.
        Point3f p2;
        for (int c = 0; c < 3; ++c)
            p2[c] = pExp(rng);
        // Make sure that the point we're tracing rays toward is in the
        // hemisphere about the intersection point's surface normal.
        w = p2 - isect.p();
        w = FaceForward(w, isect.n);
        p2 = isect.p() + w;
        rOut = isect.SpawnRayTo(p2);

        if (shape.IntersectP(rOut, 1))
            ++n;
        if (shape.Intersect(rOut, 1).has_value())
            ++n;
    }

    return n;
}